

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_merger.cpp
# Opt level: O0

void __thiscall duckdb::ARTMerger::MergeNodes(ARTMerger *this,NodeEntry *entry)

{
  NType NVar1;
  NType NVar2;
  bool bVar3;
  idx_t iVar4;
  uchar *puVar5;
  size_type sVar6;
  ARTMerger *this_00;
  Node *right;
  undefined8 *in_RSI;
  unsafe_optional_ptr<Node> child_1;
  Node *right_child_1;
  uchar byte_1;
  idx_t i_1;
  Node *right_child;
  unsafe_optional_ptr<Node> child;
  uchar byte;
  idx_t i;
  vector<unsigned_long,_true> remaining;
  NodeChildren children;
  undefined7 in_stack_fffffffffffffed8;
  uint8_t in_stack_fffffffffffffedf;
  ART *in_stack_fffffffffffffee0;
  unsafe_optional_ptr<Node> in_stack_fffffffffffffee8;
  ART *in_stack_fffffffffffffef0;
  Node *left;
  undefined8 in_stack_ffffffffffffff68;
  Node *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  IndexPointer in_stack_ffffffffffffff80;
  ulong uVar7;
  ulong uVar8;
  Node *in_stack_ffffffffffffff88;
  ARTMerger *in_stack_ffffffffffffff90;
  Node *local_68;
  uchar local_5d;
  ulong local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  array_ptr<unsigned_char,_true> local_30;
  Node local_20 [2];
  undefined8 *local_10;
  
  local_10 = in_RSI;
  NVar1 = Node::GetType((Node *)0x18cace7);
  NVar2 = Node::GetType((Node *)0x18cacff);
  if (NVar1 < NVar2) {
    ::std::swap<duckdb::Node>((Node *)*local_10,(Node *)local_10[1]);
  }
  ExtractChildren(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Node::Free(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8.ptr);
  vector<unsigned_long,_true>::vector((vector<unsigned_long,_true> *)0x18cad73);
  local_50 = 0;
  while( true ) {
    uVar7 = local_50;
    iVar4 = array_ptr<unsigned_char,_true>::size(&local_30);
    if (iVar4 <= uVar7) break;
    puVar5 = array_ptr<unsigned_char,_true>::operator[]
                       ((array_ptr<unsigned_char,_true> *)in_stack_fffffffffffffee0,
                        CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    local_5d = *puVar5;
    local_68 = (Node *)Node::GetChildMutable
                                 (in_stack_fffffffffffffee8.ptr,in_stack_fffffffffffffee0,
                                  in_stack_fffffffffffffedf);
    bVar3 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_68);
    if (bVar3) {
      ::std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffef0,
                 (unsigned_long *)in_stack_fffffffffffffee8.ptr);
    }
    else {
      array_ptr<duckdb::Node,_true>::operator[]
                ((array_ptr<duckdb::Node,_true> *)in_stack_fffffffffffffee0,
                 CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      Node::InsertChild((ART *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                        in_stack_ffffffffffffff70,
                        (uint8_t)((ulong)in_stack_ffffffffffffff68 >> 0x38),
                        (Node)in_stack_ffffffffffffff80.data);
    }
    local_50 = local_50 + 1;
  }
  uVar7 = 0;
  while( true ) {
    uVar8 = uVar7;
    sVar6 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_48);
    if (sVar6 <= uVar7) break;
    vector<unsigned_long,_true>::operator[]
              ((vector<unsigned_long,_true> *)in_stack_fffffffffffffee0,
               CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    array_ptr<unsigned_char,_true>::operator[]
              ((array_ptr<unsigned_char,_true> *)in_stack_fffffffffffffee0,
               CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    left = local_20;
    this_00 = (ARTMerger *)
              vector<unsigned_long,_true>::operator[]
                        ((vector<unsigned_long,_true> *)in_stack_fffffffffffffee0,
                         CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    right = array_ptr<duckdb::Node,_true>::operator[]
                      ((array_ptr<duckdb::Node,_true> *)in_stack_fffffffffffffee0,
                       CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    in_stack_fffffffffffffee8 =
         Node::GetChildMutable
                   (in_stack_fffffffffffffee8.ptr,in_stack_fffffffffffffee0,
                    in_stack_fffffffffffffedf);
    in_stack_fffffffffffffee0 =
         (ART *)optional_ptr<duckdb::Node,_false>::operator*
                          ((optional_ptr<duckdb::Node,_false> *)in_stack_fffffffffffffee0);
    Emplace(this_00,left,right,(GateStatus)((ulong)in_stack_fffffffffffffee8.ptr >> 0x38),
            (idx_t)in_stack_fffffffffffffee0);
    uVar7 = uVar8 + 1;
  }
  vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x18cb073);
  return;
}

Assistant:

void ARTMerger::MergeNodes(NodeEntry &entry) {
	D_ASSERT(entry.left.IsNode());
	D_ASSERT(entry.right.IsNode());

	// Merge the smaller node into the bigger node.
	if (entry.left.GetType() < entry.right.GetType()) {
		swap(entry.left, entry.right);
	}

	// Get the children of the right node.
	// Then, copy them into left.
	auto children = ExtractChildren(entry.right);
	// As long as the arena is valid,
	// the copied-out nodes (and their references) are valid.
	Node::Free(art, entry.right);

	// First, we iterate and insert children.
	// This might grow the node, so we need to do it prior to Emplace.
	vector<idx_t> remaining;
	for (idx_t i = 0; i < children.bytes.size(); i++) {
		const auto byte = children.bytes[i];
		auto child = entry.left.GetChildMutable(art, byte);

		if (!child) {
			// There is no child at this byte.
			// We can insert the right node's child at byte and are done.
			auto &right_child = children.children[i];
			Node::InsertChild(art, entry.left, byte, right_child);
			continue;
		}
		// There is a left and a right child at this byte.
		// We remember to emplace the two children.
		remaining.emplace_back(i);
	}

	// Emplace all remaining children.
	for (idx_t i = 0; i < remaining.size(); i++) {
		const auto byte = children.bytes[remaining[i]];
		auto &right_child = children.children[remaining[i]];
		auto child = entry.left.GetChildMutable(art, byte);
		Emplace(*child, right_child, entry.status, entry.depth + 1);
	}
}